

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugAranges.cpp
# Opt level: O2

uint32_t __thiscall llvm::DWARFDebugAranges::findAddress(DWARFDebugAranges *this,uint64_t Address)

{
  pointer pRVar1;
  uint32_t uVar2;
  ulong uVar3;
  pointer pRVar4;
  ulong uVar5;
  
  pRVar4 = (this->Aranges).
           super__Vector_base<llvm::DWARFDebugAranges::Range,_std::allocator<llvm::DWARFDebugAranges::Range>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->Aranges).
           super__Vector_base<llvm::DWARFDebugAranges::Range,_std::allocator<llvm::DWARFDebugAranges::Range>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)pRVar1 - (long)pRVar4 >> 4;
  while (uVar3 = uVar5, 0 < (long)uVar3) {
    uVar5 = uVar3 >> 1;
    if ((-(ulong)((ulong)pRVar4[uVar5].Length == 0) |
        pRVar4[uVar5].LowPC + (ulong)pRVar4[uVar5].Length) <= Address) {
      pRVar4 = pRVar4 + uVar5 + 1;
      uVar5 = ~uVar5 + uVar3;
    }
  }
  uVar2 = 0xffffffff;
  if ((pRVar4 != pRVar1) && (pRVar4->LowPC <= Address)) {
    uVar2 = pRVar4->CUOffset;
  }
  return uVar2;
}

Assistant:

uint32_t DWARFDebugAranges::findAddress(uint64_t Address) const {
  RangeCollIterator It =
      partition_point(Aranges, [=](Range R) { return R.HighPC() <= Address; });
  if (It != Aranges.end() && It->LowPC <= Address)
    return It->CUOffset;
  return -1U;
}